

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

DWORD GetFileType(HANDLE hFile)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  DWORD local_1c [2];
  DWORD dwFileType;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002c03ed;
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  PVar1 = CorUnix::InternalGetFileType(pThread,hFile,local_1c);
  if (PVar1 == 0) {
    if (local_1c[0] == 0) goto LAB_002c03cc;
  }
  else {
    local_1c[0] = 0;
LAB_002c03cc:
    pPVar2 = (PAL_ERROR *)__errno_location();
    *pPVar2 = PVar1;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return local_1c[0];
  }
LAB_002c03ed:
  abort();
}

Assistant:

DWORD
PALAPI
GetFileType(
        IN HANDLE hFile)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    DWORD dwFileType;

    PERF_ENTRY(GetFileType);
    ENTRY("GetFileType(hFile=%p)\n", hFile);

    pThread = InternalGetCurrentThread();

    palError = InternalGetFileType(
        pThread,
        hFile,
        &dwFileType
        );

    if (NO_ERROR != palError)
    {
        dwFileType = FILE_TYPE_UNKNOWN;
        pThread->SetLastError(palError);
    }
    else if (FILE_TYPE_UNKNOWN == dwFileType)
    {
        pThread->SetLastError(palError);
    }


    LOGEXIT("GetFileType returns DWORD %#x\n", dwFileType);
    PERF_EXIT(GetFileType);
    return dwFileType;
}